

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3WindowOffsetExpr(Parse *pParse,Expr *pExpr)

{
  Expr *pEVar1;
  Walker w;
  Walker local_48;
  
  local_48.eCode = '\x01';
  local_48.xExprCallback = exprNodeIsConstant;
  local_48.xSelectCallback = sqlite3SelectWalkFail;
  local_48.u.pNC = local_48.u.pNC & 0xffffffff00000000;
  if (pExpr != (Expr *)0x0) {
    walkExpr(&local_48,pExpr);
    if (local_48.eCode != '\0') {
      return pExpr;
    }
    if (1 < pParse->eParseMode) {
      local_48.walkerDepth = 0;
      local_48.eCode = '\0';
      local_48._37_3_ = 0;
      local_48.u.pNC = (NameContext *)0x0;
      local_48.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
      local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_48.xExprCallback = renameUnmapExprCb;
      local_48.pParse = pParse;
      walkExpr(&local_48,pExpr);
    }
    sqlite3ExprDeleteNN(pParse->db,pExpr);
    pEVar1 = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x48);
    if (pEVar1 != (Expr *)0x0) {
      pEVar1->op = '\0';
      pEVar1->affinity = '\0';
      *(undefined2 *)&pEVar1->field_0x2 = 0;
      pEVar1->flags = 0;
      (pEVar1->u).zToken = (char *)0x0;
      pEVar1->iColumn = 0;
      pEVar1->iAgg = 0;
      pEVar1->iRightJoinTable = 0;
      pEVar1->op2 = '\0';
      pEVar1->field_0x37 = 0;
      pEVar1->pAggInfo = (AggInfo *)0x0;
      (pEVar1->x).pList = (ExprList *)0x0;
      pEVar1->nHeight = 0;
      pEVar1->iTable = 0;
      pEVar1->pLeft = (Expr *)0x0;
      pEVar1->pRight = (Expr *)0x0;
      (pEVar1->y).pTab = (Table *)0x0;
      pEVar1->op = 'r';
      pEVar1->iAgg = -1;
      pEVar1->nHeight = 1;
      return pEVar1;
    }
  }
  return (Expr *)0x0;
}

Assistant:

static Expr *sqlite3WindowOffsetExpr(Parse *pParse, Expr *pExpr){
  if( 0==sqlite3ExprIsConstant(pExpr) ){
    if( IN_RENAME_OBJECT ) sqlite3RenameExprUnmap(pParse, pExpr);
    sqlite3ExprDelete(pParse->db, pExpr);
    pExpr = sqlite3ExprAlloc(pParse->db, TK_NULL, 0, 0);
  }
  return pExpr;
}